

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::JsRTConstructCallAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  ScriptContext *scriptContext;
  RecyclableObject *obj;
  RecyclableObject *pRVar5;
  undefined1 *aValue;
  JavascriptFunction *v;
  Var instance;
  undefined4 *puVar6;
  ulong uVar7;
  Arguments local_48;
  ThreadContextTTD *local_38;
  
  local_38 = executeContext;
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  if (evt->EventKind == ConstructCallActionTag) {
    obj = (RecyclableObject *)InflateVarInReplay(local_38,(TTDVar)**(undefined8 **)(evt + 2));
    if (((ulong)obj >> 0x30 == 0 && obj != (RecyclableObject *)0x0) &&
       (bVar3 = Js::VarIsImpl<Js::JavascriptFunction>(obj), bVar3)) {
      pRVar5 = Js::VarTo<Js::RecyclableObject>(obj);
      if ((((((pRVar5->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
          scriptContext.ptr != scriptContext) {
        obj = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,pRVar5,false);
      }
      if (1 < (uint)evt[1].EventTimeStamp) {
        uVar7 = 1;
        do {
          aValue = (undefined1 *)
                   InflateVarInReplay(local_38,*(TTDVar *)(*(long *)(evt + 2) + uVar7 * 8));
          if (aValue == (undefined1 *)0x0) {
            return;
          }
          if ((aValue < &DAT_1000000000000) &&
             (pRVar5 = Js::VarTo<Js::RecyclableObject>(aValue),
             (((((pRVar5->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr != scriptContext)) {
            aValue = (undefined1 *)Js::CrossSite::MarshalVar(scriptContext,pRVar5,false);
          }
          *(undefined1 **)(evt[2].EventTimeStamp + -8 + uVar7 * 8) = aValue;
          uVar7 = uVar7 + 1;
        } while (uVar7 < (uint)evt[1].EventTimeStamp);
      }
      v = Js::VarTo<Js::JavascriptFunction>(obj);
      local_48.Info._0_4_ = (int)evt[1].EventTimeStamp - 1U & 0xffff | 0x1000000;
      local_48.Info._4_4_ = 0;
      local_48.Values = (Type)evt[2].EventTimeStamp;
      pTVar1 = scriptContext->threadContext;
      bVar3 = pTVar1->reentrancySafeOrHandled;
      pTVar1->reentrancySafeOrHandled = true;
      instance = Js::JavascriptFunction::CallAsConstructor
                           (v,(Var)0x0,&local_48,scriptContext,(AuxArray<unsigned_int> *)0x0);
      pTVar1->reentrancySafeOrHandled = bVar3;
      if ((instance != (Var)0x0) &&
         (BVar4 = Js::CrossSite::NeedMarshalVar(instance,scriptContext), BVar4 != 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTActionEvents.cpp"
                           ,0x369,"(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx))",
                           "res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx)");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTConstructCallAction,(TTD::NSLogEvents::EventKind)66>
                (local_38,evt,instance);
    }
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void JsRTConstructCallAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTConstructCallAction* ccAction = GetInlineEventDataAs<JsRTConstructCallAction, EventKind::ConstructCallActionTag>(evt);

            Js::Var jsFunctionVar = InflateVarInReplay(executeContext, ccAction->ArgArray[0]);
            TTD_REPLAY_VALIDATE_INCOMING_FUNCTION(jsFunctionVar, ctx);

            //remove implicit constructor function as first arg in callInfo and argument loop below
            for (uint32 i = 1; i < ccAction->ArgCount; ++i)
            {
                Js::Var argi = InflateVarInReplay(executeContext, ccAction->ArgArray[i]);
                TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(argi, ctx);

                ccAction->ExecArgs[i - 1] = argi;
            }

            Js::JavascriptFunction* jsFunction = Js::VarTo<Js::JavascriptFunction>(jsFunctionVar);
            Js::CallInfo callInfo(Js::CallFlags::CallFlags_New, (ushort)(ccAction->ArgCount - 1));
            Js::Arguments jsArgs(callInfo, ccAction->ExecArgs);

            //
            //TODO: we will want to look at this at some point -- either treat as "top-level" call or maybe constructors are fast so we can just jump back to previous "real" code
            //TTDAssert(!Js::VarIs<Js::ScriptFunction>(jsFunction) || execContext->GetThreadContext()->TTDRootNestingCount != 0, "This will cause user code to execute and we need to add support for that as a top-level call source!!!!");
            //

            Js::Var res = nullptr;
            BEGIN_SAFE_REENTRANT_CALL(ctx->GetThreadContext())
            {
                res = Js::JavascriptFunction::CallAsConstructor(jsFunction, /* overridingNewTarget = */nullptr, jsArgs, ctx);
            }
            END_SAFE_REENTRANT_CALL
            Assert(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx));

            JsRTActionHandleResultForReplay<JsRTConstructCallAction, EventKind::ConstructCallActionTag>(executeContext, evt, res);
        }